

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O0

void BrotliBuildMetaBlockGreedy
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,uint8_t prev_byte,
               uint8_t prev_byte2,ContextLut literal_context_lut,size_t num_contexts,
               uint32_t *static_context_map,Command_conflict *commands,size_t n_commands,
               MetaBlockSplit *mb)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Command_conflict *pCVar6;
  uint8_t prev_byte2_local;
  uint8_t prev_byte_local;
  size_t mask_local;
  size_t pos_local;
  uint8_t *ringbuffer_local;
  MemoryManager *m_local;
  size_t context_1;
  ulong uStack_5c0;
  uint8_t literal_1;
  size_t j_1;
  Command_conflict cmd_1;
  size_t i_1;
  size_t num_literals_1;
  BlockSplitterDistance dist_blocks_1;
  BlockSplitterCommand cmd_blocks_1;
  anon_union_328_2_32013c24 lit_blocks_1;
  byte local_32a;
  byte local_329;
  size_t local_320;
  size_t context;
  ulong uStack_2f8;
  uint8_t literal;
  size_t j;
  Command_conflict cmd;
  size_t i;
  size_t num_literals;
  BlockSplitterDistance dist_blocks;
  BlockSplitterCommand cmd_blocks;
  anon_union_328_2_32013c24 lit_blocks;
  size_t local_58;
  
  if (num_contexts == 1) {
    i = 0;
    cmd.dist_extra_ = 0;
    cmd.cmd_prefix_ = 0;
    cmd.dist_prefix_ = 0;
    for (; (ulong)cmd._8_8_ < n_commands; cmd._8_8_ = cmd._8_8_ + 1) {
      i = commands[cmd._8_8_].insert_len_ + i;
    }
    InitBlockSplitterLiteral
              (m,(BlockSplitterLiteral *)&cmd_blocks.merge_last_count_,0x100,0x200,400.0,i,
               &mb->literal_split,&mb->literal_histograms,&mb->literal_histograms_size);
    InitBlockSplitterCommand
              (m,(BlockSplitterCommand *)&dist_blocks.merge_last_count_,0x2c0,0x400,500.0,n_commands
               ,&mb->command_split,&mb->command_histograms,&mb->command_histograms_size);
    InitBlockSplitterDistance
              (m,(BlockSplitterDistance *)&num_literals,0x40,0x200,100.0,n_commands,
               &mb->distance_split,&mb->distance_histograms,&mb->distance_histograms_size);
    cmd.dist_extra_ = 0;
    cmd.cmd_prefix_ = 0;
    cmd.dist_prefix_ = 0;
    local_58 = pos;
    for (; (ulong)cmd._8_8_ < n_commands; cmd._8_8_ = cmd._8_8_ + 1) {
      pCVar6 = commands + cmd._8_8_;
      uVar2._0_4_ = pCVar6->insert_len_;
      uVar2._4_4_ = pCVar6->copy_len_;
      uVar3._0_4_ = pCVar6->dist_extra_;
      uVar3._4_2_ = pCVar6->cmd_prefix_;
      uVar3._6_2_ = pCVar6->dist_prefix_;
      BlockSplitterAddSymbolCommand
                ((BlockSplitterCommand *)&dist_blocks.merge_last_count_,uVar3 >> 0x20 & 0xffff);
      for (uStack_2f8 = uVar2 & 0xffffffff; uStack_2f8 != 0; uStack_2f8 = uStack_2f8 - 1) {
        BlockSplitterAddSymbolLiteral
                  ((BlockSplitterLiteral *)&cmd_blocks.merge_last_count_,
                   (ulong)ringbuffer[local_58 & mask]);
        local_58 = local_58 + 1;
      }
      local_58 = (uVar2._4_4_ & 0x1ffffff) + local_58;
      if (((uVar2 & 0x1ffffff00000000) != 0) && (0x7f < (ushort)uVar3._4_2_)) {
        BlockSplitterAddSymbolDistance
                  ((BlockSplitterDistance *)&num_literals,(long)(int)((ushort)uVar3._6_2_ & 0x3ff));
      }
    }
    BlockSplitterFinishBlockLiteral((BlockSplitterLiteral *)&cmd_blocks.merge_last_count_,1);
    BlockSplitterFinishBlockCommand((BlockSplitterCommand *)&dist_blocks.merge_last_count_,1);
    BlockSplitterFinishBlockDistance((BlockSplitterDistance *)&num_literals,1);
  }
  else {
    i_1 = 0;
    cmd_1.dist_extra_ = 0;
    cmd_1.cmd_prefix_ = 0;
    cmd_1.dist_prefix_ = 0;
    for (; (ulong)cmd_1._8_8_ < n_commands; cmd_1._8_8_ = cmd_1._8_8_ + 1) {
      i_1 = commands[cmd_1._8_8_].insert_len_ + i_1;
    }
    if (num_contexts == 1) {
      InitBlockSplitterLiteral
                (m,(BlockSplitterLiteral *)&cmd_blocks_1.merge_last_count_,0x100,0x200,400.0,i_1,
                 &mb->literal_split,&mb->literal_histograms,&mb->literal_histograms_size);
    }
    else {
      InitContextBlockSplitter
                (m,(ContextBlockSplitter *)&cmd_blocks_1.merge_last_count_,0x100,num_contexts,0x200,
                 400.0,i_1,&mb->literal_split,&mb->literal_histograms,&mb->literal_histograms_size);
    }
    InitBlockSplitterCommand
              (m,(BlockSplitterCommand *)&dist_blocks_1.merge_last_count_,0x2c0,0x400,500.0,
               n_commands,&mb->command_split,&mb->command_histograms,&mb->command_histograms_size);
    InitBlockSplitterDistance
              (m,(BlockSplitterDistance *)&num_literals_1,0x40,0x200,100.0,n_commands,
               &mb->distance_split,&mb->distance_histograms,&mb->distance_histograms_size);
    cmd_1.dist_extra_ = 0;
    cmd_1.cmd_prefix_ = 0;
    cmd_1.dist_prefix_ = 0;
    local_32a = prev_byte2;
    local_329 = prev_byte;
    local_320 = pos;
    for (; (ulong)cmd_1._8_8_ < n_commands; cmd_1._8_8_ = cmd_1._8_8_ + 1) {
      pCVar6 = commands + cmd_1._8_8_;
      uVar4._0_4_ = pCVar6->insert_len_;
      uVar4._4_4_ = pCVar6->copy_len_;
      uVar5._0_4_ = pCVar6->dist_extra_;
      uVar5._4_2_ = pCVar6->cmd_prefix_;
      uVar5._6_2_ = pCVar6->dist_prefix_;
      BlockSplitterAddSymbolCommand
                ((BlockSplitterCommand *)&dist_blocks_1.merge_last_count_,uVar5 >> 0x20 & 0xffff);
      for (uStack_5c0 = uVar4 & 0xffffffff; uStack_5c0 != 0; uStack_5c0 = uStack_5c0 - 1) {
        bVar1 = ringbuffer[local_320 & mask];
        if (num_contexts == 1) {
          BlockSplitterAddSymbolLiteral
                    ((BlockSplitterLiteral *)&cmd_blocks_1.merge_last_count_,(ulong)bVar1);
        }
        else {
          ContextBlockSplitterAddSymbol
                    ((ContextBlockSplitter *)&cmd_blocks_1.merge_last_count_,m,(ulong)bVar1,
                     (ulong)static_context_map
                            [(int)(uint)(literal_context_lut[local_329] |
                                        literal_context_lut[(ulong)local_32a + 0x100])]);
        }
        local_32a = local_329;
        local_320 = local_320 + 1;
        local_329 = bVar1;
      }
      local_320 = (uVar4._4_4_ & 0x1ffffff) + local_320;
      if ((uVar4 & 0x1ffffff00000000) != 0) {
        local_32a = ringbuffer[local_320 - 2 & mask];
        local_329 = ringbuffer[local_320 - 1 & mask];
        if (0x7f < (ushort)uVar5._4_2_) {
          BlockSplitterAddSymbolDistance
                    ((BlockSplitterDistance *)&num_literals_1,
                     (long)(int)((ushort)uVar5._6_2_ & 0x3ff));
        }
      }
    }
    if (num_contexts == 1) {
      BlockSplitterFinishBlockLiteral((BlockSplitterLiteral *)&cmd_blocks_1.merge_last_count_,1);
    }
    else {
      ContextBlockSplitterFinishBlock((ContextBlockSplitter *)&cmd_blocks_1.merge_last_count_,m,1);
    }
    BlockSplitterFinishBlockCommand((BlockSplitterCommand *)&dist_blocks_1.merge_last_count_,1);
    BlockSplitterFinishBlockDistance((BlockSplitterDistance *)&num_literals_1,1);
    if (1 < num_contexts) {
      MapStaticContexts(m,num_contexts,static_context_map,mb);
    }
  }
  return;
}

Assistant:

void BrotliBuildMetaBlockGreedy(MemoryManager* m,
                                const uint8_t* ringbuffer,
                                size_t pos,
                                size_t mask,
                                uint8_t prev_byte,
                                uint8_t prev_byte2,
                                ContextLut literal_context_lut,
                                size_t num_contexts,
                                const uint32_t* static_context_map,
                                const Command* commands,
                                size_t n_commands,
                                MetaBlockSplit* mb) {
  if (num_contexts == 1) {
    BrotliBuildMetaBlockGreedyInternal(m, ringbuffer, pos, mask, prev_byte,
        prev_byte2, literal_context_lut, 1, NULL, commands, n_commands, mb);
  } else {
    BrotliBuildMetaBlockGreedyInternal(m, ringbuffer, pos, mask, prev_byte,
        prev_byte2, literal_context_lut, num_contexts, static_context_map,
        commands, n_commands, mb);
  }
}